

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

void __thiscall irr::scene::CMeshSceneNode::setMesh(CMeshSceneNode *this,IMesh *mesh)

{
  long *in_RSI;
  IReferenceCounted *in_RDI;
  CMeshSceneNode *in_stack_000000c0;
  
  if (in_RSI != (long *)0x0) {
    IReferenceCounted::grab((IReferenceCounted *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
    if (in_RDI[0x13].DebugName != (c8 *)0x0) {
      IReferenceCounted::drop(in_RDI);
    }
    in_RDI[0x13].DebugName = (c8 *)in_RSI;
    copyMaterials(in_stack_000000c0);
  }
  return;
}

Assistant:

void CMeshSceneNode::setMesh(IMesh *mesh)
{
	if (mesh) {
		mesh->grab();
		if (Mesh)
			Mesh->drop();

		Mesh = mesh;
		copyMaterials();
	}
}